

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcSetGlobal(char *name,void *data)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ExternVarInfo *pEVar4;
  FastVector<ExternTypeInfo,_false,_false> *this;
  ExternTypeInfo *pEVar5;
  uint local_30;
  uint i;
  uint hash;
  char *mem;
  void *data_local;
  char *name_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar3 = nullcGetVariableData((uint *)0x0);
    if ((((NULLC::linker != 0) && (name != (char *)0x0)) && (data != (void *)0x0)) &&
       (pvVar3 != (void *)0x0)) {
      uVar1 = NULLC::GetStringHash(name);
      for (local_30 = 0;
          uVar2 = FastVector<ExternVarInfo,_false,_false>::size
                            ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230)),
          local_30 < uVar2; local_30 = local_30 + 1) {
        pEVar4 = FastVector<ExternVarInfo,_false,_false>::operator[]
                           ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                            local_30);
        if (pEVar4->nameHash == uVar1) {
          pEVar4 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                              local_30);
          uVar1 = pEVar4->offset;
          this = (FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200);
          pEVar4 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                              local_30);
          pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[](this,pEVar4->type);
          memcpy((void *)((long)pvVar3 + (ulong)uVar1),data,(ulong)pEVar5->size);
          return '\x01';
        }
      }
    }
  }
  return '\0';
}

Assistant:

nullres nullcSetGlobal(const char* name, void* data)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !data || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
		{
			memcpy(mem + linker->exVariables[i].offset, data, linker->exTypes[linker->exVariables[i].type].size);
			return 1;
		}
	}
	return 0;
}